

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dpmr.cpp
# Opt level: O2

void __thiscall DSDcc::DSDdPMR::processVoiceFrame(DSDdPMR *this,int symbolIndex,int dibit)

{
  DSDDecoder *pDVar1;
  byte dibit_00;
  int dibitindex;
  double in_XMM0_Qa;
  double __x;
  
  if (symbolIndex == 0) {
    if ((this->m_dsdDecoder->m_opts).errorbars == 1) {
      DSDLogger::log(&this->m_dsdDecoder->m_dsdLogger,in_XMM0_Qa);
    }
  }
  else {
    dibitindex = symbolIndex % 0x24;
    if (dibitindex != 0) goto LAB_0011b837;
  }
  this->w = &rW;
  this->x = &rX;
  this->y = &rY;
  this->z = &rZ;
  pDVar1 = this->m_dsdDecoder;
  pDVar1->m_mbeDVFrame1[8] = '\0';
  pDVar1->m_mbeDVFrame1[0] = '\0';
  pDVar1->m_mbeDVFrame1[1] = '\0';
  pDVar1->m_mbeDVFrame1[2] = '\0';
  pDVar1->m_mbeDVFrame1[3] = '\0';
  pDVar1->m_mbeDVFrame1[4] = '\0';
  pDVar1->m_mbeDVFrame1[5] = '\0';
  pDVar1->m_mbeDVFrame1[6] = '\0';
  pDVar1->m_mbeDVFrame1[7] = '\0';
  dibitindex = 0;
LAB_0011b837:
  dibit_00 = (byte)dibit;
  this->m_dsdDecoder->ambe_fr[*this->w][*this->x] = dibit_00 >> 1 & 1;
  this->m_dsdDecoder->ambe_fr[*this->y][*this->z] = dibit_00 & 1;
  this->w = this->w + 1;
  this->x = this->x + 1;
  this->y = this->y + 1;
  this->z = this->z + 1;
  storeSymbolDV(this,dibitindex,dibit_00,false);
  if (dibitindex == 0x23) {
    DSDMBEDecoder::processFrame
              (&this->m_dsdDecoder->m_mbeDecoder1,(char (*) [23])0x0,this->m_dsdDecoder->ambe_fr,
               (char (*) [24])0x0);
    pDVar1 = this->m_dsdDecoder;
    pDVar1->m_mbeDVReady1 = true;
    if ((pDVar1->m_opts).errorbars == 1) {
      DSDLogger::log(&pDVar1->m_dsdLogger,__x);
      return;
    }
  }
  return;
}

Assistant:

void DSDdPMR::processVoiceFrame(int symbolIndex, int dibit)
{
    if ((symbolIndex == 0) && (m_dsdDecoder->m_opts.errorbars == 1))
    {
        m_dsdDecoder->getLogger().log("\nMBE: ");
    }

    if (symbolIndex % 36 == 0)
    {
        w = rW;
        x = rX;
        y = rY;
        z = rZ;
        memset((void *) m_dsdDecoder->m_mbeDVFrame1, 0, 9); // initialize DVSI frame
    }

    m_dsdDecoder->ambe_fr[*w][*x] = (1 & (dibit >> 1)); // bit 1
    m_dsdDecoder->ambe_fr[*y][*z] = (1 & dibit);        // bit 0
    w++;
    x++;
    y++;
    z++;

    storeSymbolDV(symbolIndex % 36, dibit); // store dibit for DVSI hardware decoder

    if (symbolIndex % 36 == 35)
    {
        m_dsdDecoder->m_mbeDecoder1.processFrame(0, m_dsdDecoder->ambe_fr, 0);
        m_dsdDecoder->m_mbeDVReady1 = true; // Indicate that a DVSI frame is available

        if (m_dsdDecoder->m_opts.errorbars == 1)
        {
            m_dsdDecoder->getLogger().log(".");
        }
    }
}